

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O1

void wallscan_striped(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat
                     )

{
  short sVar1;
  lightlist_t *plVar2;
  FDynamicColormap *pFVar3;
  bool foggy;
  int iVar4;
  short *psVar5;
  int iVar6;
  extsector_t *peVar7;
  long lVar8;
  short sVar9;
  ulong uVar10;
  short most3 [5760];
  short most1 [5760];
  short most2 [5760];
  short *local_8750;
  short local_8738 [5760];
  short local_5a38 [5760];
  short local_2d38 [5764];
  
  iVar4 = wallshade;
  foggy = ::foggy;
  pFVar3 = basecolormap;
  if (x1 < WallC.sx1) {
    __assert_fail("WallC.sx1 <= x1",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                  ,0x4ea,
                  "void wallscan_striped(int, int, short *, short *, float *, fixed_t *, double)");
  }
  if (WallC.sx2 < x2) {
    __assert_fail("WallC.sx2 >= x2",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                  ,0x4eb,
                  "void wallscan_striped(int, int, short *, short *, float *, fixed_t *, double)");
  }
  peVar7 = frontsector->e;
  if ((peVar7->XFloor).lightlist.Count != 0) {
    local_8750 = local_5a38;
    uVar10 = 0;
    do {
      iVar6 = WallMost(local_8738,&(peVar7->XFloor).lightlist.Array[uVar10].plane,&WallC);
      psVar5 = local_8750;
      if (iVar6 != 3) {
        lVar8 = (long)x1;
        if (x1 < x2) {
          do {
            sVar1 = local_8738[lVar8];
            sVar9 = dwal[lVar8];
            if (sVar1 < dwal[lVar8]) {
              sVar9 = sVar1;
            }
            if (sVar1 <= uwal[lVar8]) {
              sVar9 = uwal[lVar8];
            }
            local_8750[lVar8] = sVar9;
            lVar8 = lVar8 + 1;
          } while (x2 != lVar8);
        }
        wallscan(x1,x2,uwal,local_8750,swal,lwal,yrepeat,R_GetColumn);
        uwal = local_8750;
        psVar5 = local_5a38;
        if (local_8750 == local_5a38) {
          psVar5 = local_2d38;
        }
      }
      local_8750 = psVar5;
      plVar2 = (frontsector->e->XFloor).lightlist.Array;
      basecolormap = plVar2[uVar10].extra_colormap;
      iVar6 = side_t::GetLightLevel
                        (curline->sidedef,foggy,(int)*plVar2[uVar10].p_lightlevel,
                         plVar2[uVar10].lightsource != (F3DFloor *)0x0,(int *)0x0);
      wallshade = (iVar6 + r_actualextralight) * -0x4000 + 0x3d0000;
      uVar10 = uVar10 + 1;
      peVar7 = frontsector->e;
    } while (uVar10 < (peVar7->XFloor).lightlist.Count);
  }
  wallscan(x1,x2,uwal,dwal,swal,lwal,yrepeat,R_GetColumn);
  basecolormap = pFVar3;
  wallshade = iVar4;
  return;
}

Assistant:

void wallscan_striped (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat)
{
	FDynamicColormap *startcolormap = basecolormap;
	int startshade = wallshade;
	bool fogginess = foggy;

	short most1[MAXWIDTH], most2[MAXWIDTH], most3[MAXWIDTH];
	short *up, *down;

	up = uwal;
	down = most1;

	assert(WallC.sx1 <= x1);
	assert(WallC.sx2 >= x2);

	// kg3D - fake floors instead of zdoom light list
	for (unsigned int i = 0; i < frontsector->e->XFloor.lightlist.Size(); i++)
	{
		int j = WallMost (most3, frontsector->e->XFloor.lightlist[i].plane, &WallC);
		if (j != 3)
		{
			for (int j = x1; j < x2; ++j)
			{
				down[j] = clamp (most3[j], up[j], dwal[j]);
			}
			wallscan (x1, x2, up, down, swal, lwal, yrepeat);
			up = down;
			down = (down == most1) ? most2 : most1;
		}

		lightlist_t *lit = &frontsector->e->XFloor.lightlist[i];
		basecolormap = lit->extra_colormap;
		wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(fogginess,
			*lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
 	}

	wallscan (x1, x2, up, dwal, swal, lwal, yrepeat);
	basecolormap = startcolormap;
	wallshade = startshade;
}